

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr * __thiscall c4::yml::Tree::key_ref(Tree *this,size_t node)

{
  Location loc;
  bool bVar1;
  error_flags eVar2;
  NodeData *pNVar3;
  NodeData *pNVar4;
  Tree *in_RSI;
  size_t in_RDI;
  size_t in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  Location *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffffb8;
  Tree *pTVar5;
  size_t sVar6;
  Tree *in_stack_ffffffffffffffe8;
  size_t in_stack_fffffffffffffff0;
  
  pTVar5 = in_RSI;
  sVar6 = in_RDI;
  pNVar3 = _p(in_RSI,in_stack_ffffffffffffffb8);
  if ((((pNVar3->m_type).type & KEYREF) == NOTYPE) ||
     (in_stack_ffffffffffffffe8 = in_RSI, pNVar4 = _p(in_RSI,in_stack_ffffffffffffffb8),
     in_stack_fffffffffffffff0 = in_RDI, ((pNVar4->m_type).type & (KEYANCH|KEY)) == (KEYANCH|KEY)))
  {
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    Location::Location(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
                       ,in_stack_ffffffffffffff68);
    loc.super_LineCol.line = sVar6;
    loc.super_LineCol.offset = (size_t)pTVar5;
    loc.super_LineCol.col = (size_t)pNVar3;
    loc.name.str = (char *)in_stack_ffffffffffffffe8;
    loc.name.len = in_stack_fffffffffffffff0;
    error<57ul>((char (*) [57])in_RSI,loc);
  }
  pNVar3 = _p(in_RSI,in_stack_ffffffffffffffb8);
  return &(pNVar3->m_key).anchor;
}

Assistant:

csubstr    const& key_ref   (size_t node) const { RYML_ASSERT(is_key_ref(node) && ! has_key_anchor(node)); return _p(node)->m_key.anchor; }